

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::ZNames::ZNamesLoader::loadMetaZone
          (ZNamesLoader *this,UResourceBundle *zoneStrings,UnicodeString *mzID,UErrorCode *errorCode
          )

{
  char key [129];
  char acStack_a8 [136];
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  mergeTimeZoneKey(mzID,acStack_a8);
  loadNames(this,zoneStrings,acStack_a8,errorCode);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }